

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-mmsg.c
# Opt level: O0

int run_test_udp_mmsg(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_buf_t uVar3;
  int64_t eval_b_13;
  int64_t eval_a_13;
  int64_t eval_b_12;
  int64_t eval_a_12;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  char *local_a0;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_30 [4];
  int i;
  uv_buf_t buf;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)&buf.len);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-mmsg.c"
            ,0x6a,"0","==","uv_ip4_addr(\"0.0.0.0\", 9123, &addr)",0,"==",(long)iVar1);
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_udp_init_ex(puVar2,&recver,0x100);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-mmsg.c"
            ,0x6d,"0","==","uv_udp_init_ex(uv_default_loop(), &recver, 0 | UV_UDP_RECVMMSG)",0,"==",
            (long)iVar1);
    abort();
  }
  iVar1 = uv_udp_bind(&recver,(sockaddr *)&buf.len,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-mmsg.c"
            ,0x6f,"0","==","uv_udp_bind(&recver, (const struct sockaddr*) &addr, 0)",0,"==",
            (long)iVar1);
    abort();
  }
  iVar1 = uv_udp_recv_start(&recver,alloc_cb,recv_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-mmsg.c"
            ,0x71,"0","==","uv_udp_recv_start(&recver, alloc_cb, recv_cb)",0,"==",(long)iVar1);
    abort();
  }
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)&buf.len);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-mmsg.c"
            ,0x73,"0","==","uv_ip4_addr(\"127.0.0.1\", 9123, &addr)",0,"==",(long)iVar1);
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_udp_init(puVar2,&sender);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-mmsg.c"
            ,0x75,"0","==","uv_udp_init(uv_default_loop(), &sender)",0,"==",(long)iVar1);
    abort();
  }
  uVar3 = uv_buf_init("PING",4);
  eval_a_6 = (int64_t)uVar3.base;
  _auStack_30 = (char *)eval_a_6;
  local_a0 = (char *)uVar3.len;
  buf.base = local_a0;
  for (eval_a._4_4_ = 0; eval_a._4_4_ < 8; eval_a._4_4_ = eval_a._4_4_ + 1) {
    iVar1 = uv_udp_try_send(&sender,(uv_buf_t *)auStack_30,1,(sockaddr *)&buf.len);
    if ((long)iVar1 != 4) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-mmsg.c"
              ,0x79,"4","==","uv_udp_try_send(&sender, &buf, 1, (const struct sockaddr*) &addr)",4,
              "==",(long)iVar1);
      abort();
    }
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if ((long)iVar1 == 0) {
    if ((long)close_cb_called != 2) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-mmsg.c"
              ,0x7e,"close_cb_called","==","2",(long)close_cb_called,"==",2);
      abort();
    }
    if ((long)recv_cb_called != 8) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-mmsg.c"
              ,0x7f,"recv_cb_called","==","8",(long)recv_cb_called,"==",8);
      abort();
    }
    if (sender.send_queue_size != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-mmsg.c"
              ,0x81,"sender.send_queue_size","==","0",sender.send_queue_size,"==",0);
      abort();
    }
    if (recver.send_queue_size == 0) {
      printf("%d allocs for %d recvs\n",(ulong)(uint)alloc_cb_called,(ulong)(uint)recv_cb_called);
      iVar1 = uv_udp_using_recvmmsg(&recver);
      if (iVar1 == 0) {
        if ((long)alloc_cb_called != (long)recv_cb_called) {
          fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-mmsg.c"
                  ,0x8a,"alloc_cb_called","==","recv_cb_called",(long)alloc_cb_called,"==",
                  (long)recv_cb_called);
          abort();
        }
      }
      else if ((long)alloc_cb_called != 2) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-mmsg.c"
                ,0x88,"alloc_cb_called","==","(8 / 4)",(long)alloc_cb_called,"==",2);
        abort();
      }
      puVar2 = uv_default_loop();
      close_loop(puVar2);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-mmsg.c"
              ,0x8c,"0 == uv_loop_close(uv_default_loop())");
      abort();
    }
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-mmsg.c"
            ,0x82,"recver.send_queue_size","==","0",recver.send_queue_size,"==",0);
    abort();
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-mmsg.c"
          ,0x7c,"0","==","uv_run(uv_default_loop(), UV_RUN_DEFAULT)",0,"==",(long)iVar1);
  abort();
}

Assistant:

TEST_IMPL(udp_mmsg) {
  struct sockaddr_in addr;
  uv_buf_t buf;
  int i;

  ASSERT_EQ(0, uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  ASSERT_EQ(0, uv_udp_init_ex(uv_default_loop(), &recver,
                              AF_UNSPEC | UV_UDP_RECVMMSG));

  ASSERT_EQ(0, uv_udp_bind(&recver, (const struct sockaddr*) &addr, 0));

  ASSERT_EQ(0, uv_udp_recv_start(&recver, alloc_cb, recv_cb));

  ASSERT_EQ(0, uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  ASSERT_EQ(0, uv_udp_init(uv_default_loop(), &sender));

  buf = uv_buf_init("PING", 4);
  for (i = 0; i < NUM_SENDS; i++) {
    ASSERT_EQ(4, uv_udp_try_send(&sender, &buf, 1, (const struct sockaddr*) &addr));
  }

  ASSERT_EQ(0, uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(close_cb_called, 2);
  ASSERT_EQ(recv_cb_called, NUM_SENDS);

  ASSERT_EQ(sender.send_queue_size, 0);
  ASSERT_EQ(recver.send_queue_size, 0);

  printf("%d allocs for %d recvs\n", alloc_cb_called, recv_cb_called);

  /* On platforms that don't support mmsg, each recv gets its own alloc */
  if (uv_udp_using_recvmmsg(&recver))
    ASSERT_EQ(alloc_cb_called, EXPECTED_MMSG_ALLOCS);
  else
    ASSERT_EQ(alloc_cb_called, recv_cb_called);

  MAKE_VALGRIND_HAPPY();
  return 0;
}